

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_boundary_z2_operators<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
               (vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                *matrix)

{
  ulong *puVar1;
  pointer pVVar2;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
  *pvVar3;
  bool bVar4;
  const_iterator cVar5;
  pointer ppEVar6;
  uint uVar7;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __first1_01;
  _Bit_const_iterator __first1_02;
  _Bit_const_iterator __first1_03;
  _Bit_const_iterator __first1_04;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __last1_00;
  _Bit_const_iterator __last1_01;
  _Bit_const_iterator __last1_02;
  _Bit_const_iterator __last1_03;
  _Bit_const_iterator __last1_04;
  _Bit_const_iterator __first2;
  _Bit_const_iterator __first2_00;
  _Bit_const_iterator __first2_01;
  _Bit_const_iterator __first2_02;
  _Bit_const_iterator __first2_03;
  _Bit_const_iterator __first2_04;
  Column_settings settings;
  undefined1 local_558 [8];
  pointer puStack_550;
  shared_count sStack_548;
  undefined8 local_540;
  _Bit_pointer local_538;
  void *local_530;
  undefined4 local_528;
  long local_520;
  uint local_518;
  long local_510;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
  *local_508;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  local_500;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *local_4f8;
  char *pcStack_4f0;
  shared_count sStack_4e8;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *local_4e0;
  undefined4 *local_4d8;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  local_4d0;
  char *local_4c8;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  local_4c0;
  char *local_4b8;
  shared_count sStack_4b0;
  Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *local_4a8;
  char *local_4a0;
  shared_count sStack_498;
  char *local_490;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  col2;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  col4;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  col3;
  long local_310;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  col1;
  undefined4 local_28c;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  col0;
  
  local_530 = (void *)0x0;
  local_528 = 0;
  local_520 = 0;
  local_518 = 0;
  local_510 = 0;
  col2.super_Row_access_option.columnIndex_ = 0;
  col2.super_Row_access_option._4_4_ = 1;
  col2.super_Row_access_option.rows_ = (Row_container *)0x500000002;
  col2.super_Column_dimension_option.dim_ = 6;
  __l._M_len = 5;
  __l._M_array = (iterator)&col2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col1,__l,
             (allocator_type *)&col3);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)&col0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col1,&settings);
  if (col1.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col1.super_Row_access_option._0_8_,
                    col1._16_8_ - col1.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)(matrix->
                super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,&col0);
  col1.super_Row_access_option._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_530,&col1);
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x3bf);
  pVVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((int)local_520 - (int)local_530) * 8 + local_518;
  if ((int)uVar7 < 0) {
    ppEVar6 = *(pointer *)
               ((long)&(pVVar2->column_).
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar6 !=
        (pVVar2->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar7 = ppEVar6[-1]->rowIndex_ + 1;
      goto LAB_00179334;
    }
    col1.super_Column_dimension_option.dim_ = 0;
    col1._20_4_ = 0;
    col1.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    col1.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    col1.super_Row_access_option.columnIndex_ = 0;
    col1.super_Row_access_option._4_4_ = 0;
    col1.super_Row_access_option.rows_ = (Row_container *)0x0;
    col1.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
LAB_00179334:
    col2.super_Row_access_option._0_8_ = col2.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col1,(long)(int)uVar7,(bool *)&col2,
               (allocator_type *)&col4);
    ppEVar6 = (pVVar2->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar6 !=
        *(pointer *)
         ((long)&(pVVar2->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar7 <= (*ppEVar6)->rowIndex_) break;
        col2.super_Row_access_option.columnIndex_ = (*ppEVar6)->rowIndex_;
        cVar5 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(pVVar2->erasedValues_)._M_h,(key_type *)&col2);
        if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          puVar1 = (ulong *)(col1.super_Row_access_option._0_8_ +
                            (ulong)((*ppEVar6)->rowIndex_ >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)(*ppEVar6)->rowIndex_ & 0x3f);
        }
        ppEVar6 = ppEVar6 + 1;
      } while (ppEVar6 !=
               *(pointer *)
                ((long)&(pVVar2->column_).
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1.super__Bit_iterator_base._M_offset =
       (uint)col1.column_.
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  __last1.super__Bit_iterator_base._M_p = (_Bit_type *)col1._16_8_;
  if ((ulong)(uint)col1.column_.
                   super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start +
      (col1._16_8_ - col1.super_Row_access_option._0_8_) * 8 ==
      (ulong)local_518 + (local_520 - (long)local_530) * 8) {
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p = (_Bit_type *)col1.super_Row_access_option._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = (_Bit_type *)local_530;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1,__last1,__first2);
  }
  else {
    bVar4 = false;
  }
  col3.super_Row_access_option.columnIndex_._0_1_ = bVar4;
  col3.super_Row_access_option.rows_ = (Row_container *)0x0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&col4;
  col4.super_Row_access_option._0_8_ = anon_var_dwarf_c4d0f;
  col4.super_Row_access_option.rows_ = (Row_container *)0x1ec5a9;
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002283b0;
  col2.super_Column_dimension_option.dim_ = 0x230120;
  col2._20_4_ = 0;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d0 = "";
  boost::test_tools::tt_detail::report_assertion(&col3,&col2,&local_d8,0x3bf,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col3.super_Column_dimension_option);
  if (col1.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col1.super_Row_access_option._0_8_,
                    (long)col1.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    col1.super_Row_access_option._0_8_);
  }
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x3c1);
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228440;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1e61b6;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  pVVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_4c0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )(((long)*(pointer *)
                         ((long)&(pVVar2->column_).
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&(pVVar2->column_).
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                (pVVar2->erasedValues_)._M_h._M_element_count);
  local_4f8 = &local_4c0;
  local_4a8 = &local_4d0;
  col4.super_Row_access_option.columnIndex_._0_1_ =
       local_4c0 ==
       (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
        )0x3;
  local_4d0.super_Entry_column_index_option.columnIndex_ = 3;
  col4.super_Row_access_option.rows_ = (Row_container *)0x0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  local_558 = (undefined1  [8])0x1e68bf;
  puStack_550 = (pointer)0x1e6932;
  col1.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4f8;
  col1.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col1.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col1.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228400;
  col1._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4a8;
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002286c0;
  col2.super_Column_dimension_option.dim_ = 0x230120;
  col2._20_4_ = 0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  col3.super_Row_access_option.columnIndex_ = 0;
  col3.super_Row_access_option._4_4_ = 1;
  col3.super_Row_access_option.rows_ = (Row_container *)0x500000002;
  col3.super_Column_dimension_option.dim_ = 6;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&col3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col2,__l_00,
             (allocator_type *)&col4);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)&col1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col2,&settings);
  if (col2.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col2.super_Row_access_option._0_8_,
                    CONCAT44(col2._20_4_,col2.super_Column_dimension_option.dim_) -
                    col2.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1),&col1);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_530,0,0);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x3c8);
  pVVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((int)local_520 - (int)local_530) * 8 + local_518;
  if ((int)uVar7 < 0) {
    ppEVar6 = *(pointer *)
               ((long)&pVVar2[1].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar6 !=
        pVVar2[1].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar7 = ppEVar6[-1]->rowIndex_ + 1;
      goto LAB_00179743;
    }
    col2.super_Column_dimension_option.dim_ = 0;
    col2._20_4_ = 0;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    col2.super_Row_access_option.columnIndex_ = 0;
    col2.super_Row_access_option._4_4_ = 0;
    col2.super_Row_access_option.rows_ = (Row_container *)0x0;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
LAB_00179743:
    col3.super_Row_access_option._0_8_ = col3.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col2,(long)(int)uVar7,(bool *)&col3,
               (allocator_type *)local_558);
    ppEVar6 = pVVar2[1].column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar6 !=
        *(pointer *)
         ((long)&pVVar2[1].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar7 <= (*ppEVar6)->rowIndex_) break;
        col3.super_Row_access_option.columnIndex_ = (*ppEVar6)->rowIndex_;
        cVar5 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&pVVar2[1].erasedValues_._M_h,(key_type *)&col3);
        if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          puVar1 = (ulong *)(col2.super_Row_access_option._0_8_ +
                            (ulong)((*ppEVar6)->rowIndex_ >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)(*ppEVar6)->rowIndex_ & 0x3f);
        }
        ppEVar6 = ppEVar6 + 1;
      } while (ppEVar6 !=
               *(pointer *)
                ((long)&pVVar2[1].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_00.super__Bit_iterator_base._M_p._4_4_ = col2._20_4_;
  __last1_00.super__Bit_iterator_base._M_p._0_4_ = col2.super_Column_dimension_option.dim_;
  __last1_00.super__Bit_iterator_base._M_offset =
       col2.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  if (((ulong)col2.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff) +
      (CONCAT44(col2._20_4_,col2.super_Column_dimension_option.dim_) -
      col2.super_Row_access_option._0_8_) * 8 ==
      (ulong)local_518 + (local_520 - (long)local_530) * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)col2.super_Row_access_option._0_8_;
    __last1_00.super__Bit_iterator_base._12_4_ = 0;
    __first2_00.super__Bit_iterator_base._8_8_ = 0;
    __first2_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_530;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1_00,__first2_00);
  }
  else {
    bVar4 = false;
  }
  col4.super_Row_access_option.columnIndex_._0_1_ = bVar4;
  col4.super_Row_access_option.rows_ = (Row_container *)0x0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  local_558 = (undefined1  [8])0x1ec5bd;
  puStack_550 = (pointer)0x1ec5ed;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002283b0;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_558;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_120 = "";
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_128,0x3c8,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  if (col2.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col2.super_Row_access_option._0_8_,
                    (long)col2.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    col2.super_Row_access_option._0_8_);
  }
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x3ca);
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228440;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1e61b6;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  pVVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_4d0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )(((long)*(pointer *)
                         ((long)&pVVar2[1].column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&pVVar2[1].column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                pVVar2[1].erasedValues_._M_h._M_element_count);
  local_4c0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_500;
  local_558[0] = local_4d0 ==
                 (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                  )0x0;
  local_500 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )((ulong)local_500.rowIndex_ << 0x20);
  puStack_550 = (pointer)0x0;
  sStack_548.pi_ = (sp_counted_base *)0x0;
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1e68bf;
  pcStack_4f0 = "";
  local_4a8 = &local_4d0;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228400;
  col2.super_Column_dimension_option.dim_ = 0x230120;
  col2._20_4_ = 0;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4a8;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002286c0;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_4c0;
  boost::test_tools::tt_detail::report_assertion
            (local_558,&col4,&local_4f8,0x3ca,1,2,2,"matrix[1].size()",&col2,"0",&col3);
  boost::detail::shared_count::~shared_count(&sStack_548);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4),&col1);
  col2.super_Row_access_option._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_530,&col2);
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x3d0);
  pVVar2 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((int)local_520 - (int)local_530) * 8 + local_518;
  local_508 = matrix;
  if ((int)uVar7 < 0) {
    ppEVar6 = *(pointer *)
               ((long)&pVVar2[4].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar6 !=
        pVVar2[4].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar7 = ppEVar6[-1]->rowIndex_ + 1;
      goto LAB_00179b2c;
    }
    col2.super_Column_dimension_option.dim_ = 0;
    col2._20_4_ = 0;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    col2.super_Row_access_option.columnIndex_ = 0;
    col2.super_Row_access_option._4_4_ = 0;
    col2.super_Row_access_option.rows_ = (Row_container *)0x0;
    col2.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
LAB_00179b2c:
    col3.super_Row_access_option._0_8_ = col3.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col2,(long)(int)uVar7,(bool *)&col3,
               (allocator_type *)local_558);
    ppEVar6 = pVVar2[4].column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar6 !=
        *(pointer *)
         ((long)&pVVar2[4].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar7 <= (*ppEVar6)->rowIndex_) break;
        col3.super_Row_access_option.columnIndex_ = (*ppEVar6)->rowIndex_;
        cVar5 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&pVVar2[4].erasedValues_._M_h,(key_type *)&col3);
        if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          puVar1 = (ulong *)(col2.super_Row_access_option._0_8_ +
                            (ulong)((*ppEVar6)->rowIndex_ >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)(*ppEVar6)->rowIndex_ & 0x3f);
        }
        ppEVar6 = ppEVar6 + 1;
      } while (ppEVar6 !=
               *(pointer *)
                ((long)&pVVar2[4].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_01.super__Bit_iterator_base._M_p._4_4_ = col2._20_4_;
  __last1_01.super__Bit_iterator_base._M_p._0_4_ = col2.super_Column_dimension_option.dim_;
  __last1_01.super__Bit_iterator_base._M_offset =
       col2.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  if (((ulong)col2.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff) +
      (CONCAT44(col2._20_4_,col2.super_Column_dimension_option.dim_) -
      col2.super_Row_access_option._0_8_) * 8 ==
      (ulong)local_518 + (local_520 - (long)local_530) * 8) {
    __first1_01.super__Bit_iterator_base._8_8_ = 0;
    __first1_01.super__Bit_iterator_base._M_p = (_Bit_type *)col2.super_Row_access_option._0_8_;
    __last1_01.super__Bit_iterator_base._12_4_ = 0;
    __first2_01.super__Bit_iterator_base._8_8_ = 0;
    __first2_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_530;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_01,__last1_01,__first2_01);
  }
  else {
    bVar4 = false;
  }
  pvVar3 = local_508;
  col4.super_Row_access_option.columnIndex_._0_1_ = bVar4;
  col4.super_Row_access_option.rows_ = (Row_container *)0x0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  local_558 = (undefined1  [8])0x1ec601;
  puStack_550 = (pointer)0x1ec631;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002283b0;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_170 = "";
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_558;
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_178,0x3d0,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  if (col2.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col2.super_Row_access_option._0_8_,
                    (long)col2.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    col2.super_Row_access_option._0_8_);
  }
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x3d2);
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228440;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1e61b6;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  pVVar2 = (pvVar3->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_4d0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )(((long)*(pointer *)
                         ((long)&pVVar2[4].column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&pVVar2[4].column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                pVVar2[4].erasedValues_._M_h._M_element_count);
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228400;
  col2.super_Column_dimension_option.dim_ = 0x230120;
  col2._20_4_ = 0;
  col2.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4a8;
  local_558[0] = local_4d0 ==
                 (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                  )0x3;
  local_500.super_Entry_column_index_option.columnIndex_ = 3;
  puStack_550 = (pointer)0x0;
  sStack_548.pi_ = (sp_counted_base *)0x0;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1e68bf;
  pcStack_4f0 = "";
  local_4a8 = &local_4d0;
  local_4c0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_500;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002286c0;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_4c0;
  boost::test_tools::tt_detail::report_assertion
            (local_558,&col4,&local_4f8,0x3d2,1,2,2,"matrix[4].size()",&col2,"3",&col3);
  boost::detail::shared_count::~shared_count(&sStack_548);
  col3.super_Row_access_option.columnIndex_ = 0;
  col3.super_Row_access_option._4_4_ = 0;
  col3.super_Row_access_option.rows_ = (Row_container *)0x0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)&col2,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col3,&settings);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
                    col3.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((pvVar3->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&col2);
  col3.super_Row_access_option._0_7_ = 0x1010000010101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_530,&col3);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x3d8);
  pVVar2 = (pvVar3->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((int)local_520 - (int)local_530) * 8 + local_518;
  if ((int)uVar7 < 0) {
    ppEVar6 = *(pointer *)
               ((long)&pVVar2[5].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar6 !=
        pVVar2[5].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar7 = ppEVar6[-1]->rowIndex_ + 1;
      goto LAB_00179f5e;
    }
    col3.super_Column_dimension_option.dim_ = 0;
    col3._20_4_ = 0;
    col3.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    col3.super_Row_access_option.columnIndex_ = 0;
    col3.super_Row_access_option._4_4_ = 0;
    col3.super_Row_access_option.rows_ = (Row_container *)0x0;
    col3.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
LAB_00179f5e:
    col4.super_Row_access_option._0_8_ = col4.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col3,(long)(int)uVar7,(bool *)&col4,
               (allocator_type *)&local_4f8);
    ppEVar6 = pVVar2[5].column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar6 !=
        *(pointer *)
         ((long)&pVVar2[5].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar7 <= (*ppEVar6)->rowIndex_) break;
        col4.super_Row_access_option.columnIndex_ = (*ppEVar6)->rowIndex_;
        cVar5 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&pVVar2[5].erasedValues_._M_h,(key_type *)&col4);
        if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          puVar1 = (ulong *)(col3.super_Row_access_option._0_8_ +
                            (ulong)((*ppEVar6)->rowIndex_ >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)(*ppEVar6)->rowIndex_ & 0x3f);
        }
        ppEVar6 = ppEVar6 + 1;
      } while (ppEVar6 !=
               *(pointer *)
                ((long)&pVVar2[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_02.super__Bit_iterator_base._M_p._4_4_ = col3._20_4_;
  __last1_02.super__Bit_iterator_base._M_p._0_4_ = col3.super_Column_dimension_option.dim_;
  __last1_02.super__Bit_iterator_base._M_offset =
       col3.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  if (((ulong)col3.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff) +
      (CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
      col3.super_Row_access_option._0_8_) * 8 ==
      (ulong)local_518 + (local_520 - (long)local_530) * 8) {
    __first1_02.super__Bit_iterator_base._8_8_ = 0;
    __first1_02.super__Bit_iterator_base._M_p = (_Bit_type *)col3.super_Row_access_option._0_8_;
    __last1_02.super__Bit_iterator_base._12_4_ = 0;
    __first2_02.super__Bit_iterator_base._8_8_ = 0;
    __first2_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_530;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_02,__last1_02,__first2_02);
  }
  else {
    bVar4 = false;
  }
  pvVar3 = local_508;
  local_558[0] = bVar4;
  puStack_550 = (pointer)0x0;
  sStack_548.pi_ = (sp_counted_base *)0x0;
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1ec643;
  pcStack_4f0 = "";
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002283b0;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1c0 = "";
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = &local_4f8;
  boost::test_tools::tt_detail::report_assertion(local_558,&col4,&local_1c8,0x3d8,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_548);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    (long)col3.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    col3.super_Row_access_option._0_8_);
  }
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x3da);
  puStack_550 = (pointer)((ulong)puStack_550 & 0xffffffffffffff00);
  local_558 = (undefined1  [8])&PTR__lazy_ostream_00228440;
  sStack_548.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_540._0_4_ = 0x1e61b6;
  local_540._4_4_ = 0;
  pVVar2 = (pvVar3->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_500 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )(((long)*(pointer *)
                         ((long)&pVVar2[5].column_.
                                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                                 ._M_impl + 8) -
                  *(long *)&pVVar2[5].column_.
                            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data >> 3) -
                pVVar2[5].erasedValues_._M_h._M_element_count);
  local_4d0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_4d8;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228400;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  col3.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_4c0;
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)CONCAT71(local_4f8._1_7_,
                          local_500 ==
                          (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                           )0x5);
  local_4d8 = (undefined4 *)CONCAT44(local_4d8._4_4_,5);
  pcStack_4f0 = (char *)0x0;
  sStack_4e8.pi_ = (sp_counted_base *)0x0;
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  local_4a8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1e68bf;
  local_4a0 = "";
  local_4c0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_500;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002286c0;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_4d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_4f8,local_558,&local_4a8,0x3da,1,2,2,"matrix[5].size()",&col3,"5",&col4);
  boost::detail::shared_count::~shared_count(&sStack_4e8);
  local_558 = (undefined1  [8])0x300000002;
  puStack_550 = (pointer)CONCAT44(puStack_550._4_4_,6);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_558;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,__l_01,
             (allocator_type *)&local_4f8);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)&col3,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,&settings);
  if (col4.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col4.super_Row_access_option._0_8_,
                    col4._16_8_ - col4.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((pvVar3->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&col3);
  col4.super_Row_access_option._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_530,&col4);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x3e0);
  pVVar2 = (pvVar3->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((int)local_520 - (int)local_530) * 8 + local_518;
  if ((int)uVar7 < 0) {
    ppEVar6 = *(pointer *)
               ((long)&pVVar2[5].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar6 !=
        pVVar2[5].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar7 = ppEVar6[-1]->rowIndex_ + 1;
      goto LAB_0017a3aa;
    }
    col4.super_Column_dimension_option.dim_ = 0;
    col4._20_4_ = 0;
    col4.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    col4.super_Row_access_option.columnIndex_ = 0;
    col4.super_Row_access_option._4_4_ = 0;
    col4.super_Row_access_option.rows_ = (Row_container *)0x0;
    col4.column_.
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
LAB_0017a3aa:
    local_558 = (undefined1  [8])((ulong)local_558 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col4,(long)(int)uVar7,(bool *)local_558,
               (allocator_type *)&local_4a8);
    ppEVar6 = pVVar2[5].column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ppEVar6 !=
        *(pointer *)
         ((long)&pVVar2[5].column_.
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                 ._M_impl + 8)) {
      do {
        if (uVar7 <= (*ppEVar6)->rowIndex_) break;
        local_558._0_4_ = (*ppEVar6)->rowIndex_;
        cVar5 = std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&pVVar2[5].erasedValues_._M_h,(key_type *)local_558);
        if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          puVar1 = (ulong *)(col4.super_Row_access_option._0_8_ +
                            (ulong)((*ppEVar6)->rowIndex_ >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)(*ppEVar6)->rowIndex_ & 0x3f);
        }
        ppEVar6 = ppEVar6 + 1;
      } while (ppEVar6 !=
               *(pointer *)
                ((long)&pVVar2[5].column_.
                        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                        ._M_impl + 8));
    }
  }
  __last1_03.super__Bit_iterator_base._M_offset =
       col4.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  __last1_03.super__Bit_iterator_base._M_p = (_Bit_type *)col4._16_8_;
  if (((ulong)col4.column_.
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff) +
      (col4._16_8_ - col4.super_Row_access_option._0_8_) * 8 ==
      (ulong)local_518 + (local_520 - (long)local_530) * 8) {
    __first1_03.super__Bit_iterator_base._8_8_ = 0;
    __first1_03.super__Bit_iterator_base._M_p = (_Bit_type *)col4.super_Row_access_option._0_8_;
    __last1_03.super__Bit_iterator_base._12_4_ = 0;
    __first2_03.super__Bit_iterator_base._8_8_ = 0;
    __first2_03.super__Bit_iterator_base._M_p = (_Bit_type *)local_530;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_03,__last1_03,__first2_03);
  }
  else {
    bVar4 = false;
  }
  pvVar3 = local_508;
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)CONCAT71(local_4f8._1_7_,bVar4);
  pcStack_4f0 = (char *)0x0;
  sStack_4e8.pi_ = (sp_counted_base *)0x0;
  local_4a8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1ec643;
  local_4a0 = "";
  puStack_550 = (pointer)((ulong)puStack_550 & 0xffffffffffffff00);
  local_558 = (undefined1  [8])&PTR__lazy_ostream_002283b0;
  sStack_548.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_210 = "";
  local_540 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)&local_4a8;
  boost::test_tools::tt_detail::report_assertion(&local_4f8,local_558,&local_218,0x3e0,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_4e8);
  if (col4.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col4.super_Row_access_option._0_8_,
                    (long)col4.column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    col4.super_Row_access_option._0_8_);
  }
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x3e2);
  pcStack_4f0 = (char *)((ulong)pcStack_4f0 & 0xffffffffffffff00);
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)&PTR__lazy_ostream_00228440;
  sStack_4e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1e61b6;
  pVVar2 = (pvVar3->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_4d8 = (undefined4 *)
              (((long)*(pointer *)
                       ((long)&pVVar2[5].column_.
                               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                               ._M_impl + 8) -
                *(long *)&pVVar2[5].column_.
                          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data >> 3) -
              pVVar2[5].erasedValues_._M_h._M_element_count);
  local_500 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_310;
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228400;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_4d0;
  local_4a8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)CONCAT71(local_4a8._1_7_,local_4d8 == (undefined4 *)0x4);
  local_310 = CONCAT44(local_310._4_4_,4);
  local_4a0 = (char *)0x0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  puStack_550 = (pointer)((ulong)puStack_550 & 0xffffffffffffff00);
  local_4c0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )0x1e68bf;
  local_4b8 = "";
  local_4d0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_4d8;
  local_558 = (undefined1  [8])&PTR__lazy_ostream_002286c0;
  sStack_548.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_540 = &local_500;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a8,&local_4f8,&local_4c0,0x3e2,1,2,2,"matrix[5].size()",&col4,"4",local_558);
  boost::detail::shared_count::~shared_count(&sStack_498);
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x100000000;
  pcStack_4f0 = (char *)0x500000003;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_4f8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558,__l_02,
             (allocator_type *)&local_4a8);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)&col4,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_558,&settings);
  if (local_558 != (undefined1  [8])0x0) {
    operator_delete((void *)local_558,(long)sStack_548.pi_ - (long)local_558);
  }
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  _add<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((Vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)((pvVar3->
                 super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3),&col4);
  local_558._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_530,local_558);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,1000);
  pVVar2 = (pvVar3->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((int)local_520 - (int)local_530) * 8 + local_518;
  if ((int)uVar7 < 0) {
    ppEVar6 = *(pointer *)
               ((long)&pVVar2[3].column_.
                       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                       ._M_impl + 8);
    if (ppEVar6 ==
        pVVar2[3].column_.
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sStack_548.pi_ = (sp_counted_base *)0x0;
      local_540 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                   *)0x0;
      local_558 = (undefined1  [8])0x0;
      puStack_550 = (pointer)0x0;
      local_538 = (_Bit_pointer)0x0;
      goto LAB_0017a86d;
    }
    uVar7 = ppEVar6[-1]->rowIndex_ + 1;
  }
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)((ulong)local_4f8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_558,(long)(int)uVar7,(bool *)&local_4f8,
             (allocator_type *)&local_4c0);
  ppEVar6 = pVVar2[3].column_.
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar6 !=
      *(pointer *)
       ((long)&pVVar2[3].column_.
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
               ._M_impl + 8)) {
    do {
      if (uVar7 <= (*ppEVar6)->rowIndex_) break;
      local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                   *)CONCAT44(local_4f8._4_4_,(*ppEVar6)->rowIndex_);
      cVar5 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&pVVar2[3].erasedValues_._M_h,(key_type *)&local_4f8);
      if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        *(Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
          *)((long)local_558 + (ulong)((*ppEVar6)->rowIndex_ >> 6) * 8) =
             (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
              )((ulong)*(Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                         *)((long)local_558 + (ulong)((*ppEVar6)->rowIndex_ >> 6) * 8) |
               1L << ((byte)(*ppEVar6)->rowIndex_ & 0x3f));
      }
      ppEVar6 = ppEVar6 + 1;
    } while (ppEVar6 !=
             *(pointer *)
              ((long)&pVVar2[3].column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                      ._M_impl + 8));
  }
LAB_0017a86d:
  __last1_04.super__Bit_iterator_base._M_offset = (uint)local_540;
  __last1_04.super__Bit_iterator_base._M_p = (_Bit_type *)sStack_548.pi_;
  if (((ulong)local_540 & 0xffffffff) + ((long)sStack_548.pi_ - (long)local_558) * 8 ==
      (ulong)local_518 + (local_520 - (long)local_530) * 8) {
    __first1_04.super__Bit_iterator_base._8_8_ = 0;
    __first1_04.super__Bit_iterator_base._M_p = (_Bit_type *)local_558;
    __last1_04.super__Bit_iterator_base._12_4_ = 0;
    __first2_04.super__Bit_iterator_base._8_8_ = 0;
    __first2_04.super__Bit_iterator_base._M_p = (_Bit_type *)local_530;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_04,__last1_04,__first2_04);
  }
  else {
    bVar4 = false;
  }
  pvVar3 = local_508;
  local_4a8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)CONCAT71(local_4a8._1_7_,bVar4);
  local_4a0 = (char *)0x0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_4c0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )0x1ec689;
  local_4b8 = "";
  pcStack_4f0 = (char *)((ulong)pcStack_4f0 & 0xffffffffffffff00);
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)&PTR__lazy_ostream_002283b0;
  sStack_4e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_260 = "";
  local_4e0 = &local_4c0;
  boost::test_tools::tt_detail::report_assertion(&local_4a8,&local_4f8,&local_268,1000,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_498);
  if (local_558 != (undefined1  [8])0x0) {
    operator_delete((void *)local_558,(long)local_538 - (long)local_558);
  }
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_278,0x3ea);
  local_4a0 = (char *)((ulong)local_4a0 & 0xffffffffffffff00);
  local_4a8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)&PTR__lazy_ostream_00228440;
  sStack_498.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  pVVar2 = (pvVar3->
           super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_310 = ((long)*(pointer *)
                      ((long)&pVVar2[3].column_.
                              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                              ._M_impl + 8) -
               *(long *)&pVVar2[3].column_.
                         super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data >> 3) -
              pVVar2[3].erasedValues_._M_h._M_element_count;
  local_4d8 = &local_28c;
  local_4c0.super_Entry_column_index_option.columnIndex_._0_1_ = local_310 == 4;
  local_28c = 4;
  local_4b8 = (char *)0x0;
  sStack_4b0.pi_ = (sp_counted_base *)0x0;
  local_4d0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )0x1e68bf;
  local_4c8 = "";
  local_500 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               )&local_310;
  puStack_550 = (pointer)((ulong)puStack_550 & 0xffffffffffffff00);
  local_558 = (undefined1  [8])&PTR__lazy_ostream_00228400;
  sStack_548.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_540 = &local_500;
  pcStack_4f0 = (char *)((ulong)pcStack_4f0 & 0xffffffffffffff00);
  local_4f8 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)&PTR__lazy_ostream_002286c0;
  sStack_4e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4e0 = (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)&local_4d8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4b0);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&col4);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&col3);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&col2);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&col1);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&col0);
  if (local_530 != (void *)0x0) {
    operator_delete(local_530,local_510 - (long)local_530);
  }
  return;
}

Assistant:

void column_test_boundary_z2_operators(std::vector<Column>& matrix) {
  using cont = std::vector<unsigned int>;

  std::vector<bool> veccont;
  typename Column::Column_settings settings;

  const Column col0(cont{0, 1, 2, 5, 6}, &settings);
  matrix[0] += col0;

  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 3);
  }

  const Column col1(cont{0, 1, 2, 5, 6}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(3, col1);
  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 3);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  }
  // this = this + column * v
  const Column col3(cont{2, 3, 6}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 4);
  }
  // this = v * this + column
  const Column col4(cont{0, 1, 3, 5}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 4);
  }
}